

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolInfo.cpp
# Opt level: O3

void __thiscall
MethodInfo::MethodInfo
          (MethodInfo *this,string *_name,bool _isPublic,shared_ptr<TypeInfo> *_returnType)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + _name->_M_string_length);
  this->isPublic = _isPublic;
  (this->returnType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_returnType->super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (_returnType->super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (this->returnType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->fields).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fields).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->arguments).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->arguments).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

MethodInfo::MethodInfo( const std::string & _name, bool _isPublic, std::shared_ptr<TypeInfo> _returnType )
	:name( _name ), isPublic( _isPublic ), returnType( _returnType )
{}